

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

int deqp::gles31::bb::anon_unknown_11::computeReferenceLayout
              (BufferLayout *layout,int curBlockNdx,int baseOffset,string *curPrefix,VarType *type,
              deUint32 layoutFlags)

{
  DataType DVar1;
  int iVar2;
  VarType *pVVar3;
  int iVar4;
  int iVar5;
  StructType *pSVar6;
  pointer pSVar7;
  uint baseOffset_00;
  int stride;
  BufferVarLayoutEntry entry;
  int local_e4;
  ulong local_e0;
  value_type local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((layoutFlags & 4) == 0) {
    iVar4 = computeStd430BaseAlignment(type,layoutFlags);
  }
  else {
    iVar4 = computeStd140BaseAlignment(type,layoutFlags);
  }
  baseOffset_00 = (baseOffset + iVar4) - 1U & -iVar4;
  if (type->m_type == TYPE_ARRAY) {
    pVVar3 = (type->m_data).array.elementType;
    if (pVVar3->m_type != TYPE_BASIC) {
      for (local_e4 = 0; local_e4 < (type->m_data).array.size; local_e4 = local_e4 + 1) {
        std::operator+(&local_50,curPrefix,"[");
        de::toString<int>(&local_70,&local_e4);
        std::operator+(&local_90,&local_50,&local_70);
        std::operator+(&local_d8.name,&local_90,"]");
        iVar4 = computeReferenceLayout
                          (layout,curBlockNdx,baseOffset_00,&local_d8.name,
                           (type->m_data).array.elementType,layoutFlags);
        baseOffset_00 = baseOffset_00 + iVar4;
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
      goto LAB_013c8dde;
    }
    DVar1 = (pVVar3->m_data).basic.type;
    local_e0 = (ulong)DVar1;
    if (DVar1 - TYPE_DOUBLE_MAT2 < 9 || DVar1 - TYPE_FLOAT_MAT2 < 9) {
      if ((layoutFlags & 0x10) == 0) {
        iVar5 = glu::getDataTypeMatrixNumColumns(DVar1);
      }
      else {
        iVar5 = glu::getDataTypeMatrixNumRows(DVar1);
      }
      local_d8.name._M_dataplus._M_p = (pointer)&local_d8.name.field_2;
      local_d8.name._M_string_length = 0;
      local_d8.name.field_2._M_local_buf[0] = '\0';
      local_d8.type = TYPE_LAST;
      local_d8.blockNdx = -1;
      local_d8.offset = -1;
      local_d8.arraySize = -1;
      local_d8.arrayStride = -1;
      local_d8.matrixStride = -1;
      local_d8.topLevelArraySize = -1;
      local_d8.topLevelArrayStride = -1;
      local_d8.isRowMajor = false;
      std::operator+(&local_90,curPrefix,"[0]");
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      local_d8.type = (DataType)local_e0;
      iVar2 = (type->m_data).array.size;
      local_d8.arrayStride = iVar5 * iVar4;
      local_d8.arraySize = iVar2;
      local_d8.isRowMajor = SUB41((layoutFlags & 0x10) >> 4,0);
      local_d8.topLevelArraySize = 1;
      local_d8.topLevelArrayStride = 0;
      local_d8.blockNdx = curBlockNdx;
      local_d8.offset = baseOffset_00;
      local_d8.matrixStride = iVar4;
      std::
      vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
      ::push_back(&layout->bufferVars,&local_d8);
      baseOffset_00 = baseOffset_00 + iVar2 * iVar5 * iVar4;
      std::__cxx11::string::~string((string *)&local_d8);
      goto LAB_013c8dde;
    }
    local_d8.name._M_dataplus._M_p = (pointer)&local_d8.name.field_2;
    local_d8.name._M_string_length = 0;
    local_d8.name.field_2._M_local_buf[0] = '\0';
    local_d8.type = TYPE_LAST;
    local_d8.blockNdx = -1;
    local_d8.offset = -1;
    local_d8.arraySize = -1;
    local_d8.arrayStride = -1;
    local_d8.matrixStride = -1;
    local_d8.topLevelArraySize = -1;
    local_d8.topLevelArrayStride = -1;
    local_d8.isRowMajor = false;
    std::operator+(&local_90,curPrefix,"[0]");
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    iVar5 = (type->m_data).array.size;
    local_d8.arrayStride = iVar4;
    local_d8.arraySize = iVar5;
    local_d8.matrixStride = 0;
    local_d8.topLevelArraySize = 1;
    local_d8.topLevelArrayStride = 0;
    local_d8.type = DVar1;
    local_d8.blockNdx = curBlockNdx;
    local_d8.offset = baseOffset_00;
    std::
    vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
    ::push_back(&layout->bufferVars,&local_d8);
    iVar5 = iVar5 * iVar4;
  }
  else {
    if (type->m_type != TYPE_BASIC) {
      local_e0 = CONCAT44(local_e0._4_4_,-iVar4);
      pSVar6 = (type->m_data).structPtr;
      for (pSVar7 = (pSVar6->m_members).
                    super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar7 != (pSVar6->m_members).
                    super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pSVar7 = pSVar7 + 1) {
        std::operator+(&local_90,curPrefix,".");
        std::operator+(&local_d8.name,&local_90,(pSVar7->m_name)._M_dataplus._M_p);
        iVar5 = computeReferenceLayout
                          (layout,curBlockNdx,baseOffset_00,&local_d8.name,&pSVar7->m_type,
                           layoutFlags);
        baseOffset_00 = baseOffset_00 + iVar5;
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_90);
        pSVar6 = (type->m_data).structPtr;
      }
      baseOffset_00 = (baseOffset_00 + iVar4) - 1 & (uint)local_e0;
      goto LAB_013c8dde;
    }
    DVar1 = (type->m_data).basic.type;
    local_d8.name._M_dataplus._M_p = (pointer)&local_d8.name.field_2;
    local_d8.name._M_string_length = 0;
    local_d8.name.field_2._M_local_buf[0] = '\0';
    local_d8.type = TYPE_LAST;
    local_d8.blockNdx = -1;
    local_d8.offset = -1;
    local_d8.arraySize = -1;
    local_d8.arrayStride = -1;
    local_d8.matrixStride = -1;
    local_d8.topLevelArraySize = -1;
    local_d8.topLevelArrayStride = -1;
    local_d8.isRowMajor = false;
    std::__cxx11::string::_M_assign((string *)&local_d8);
    local_d8.arraySize = 1;
    local_d8.arrayStride = 0;
    local_d8.matrixStride = 0;
    local_d8.topLevelArraySize = 1;
    local_d8.topLevelArrayStride = 0;
    local_d8.type = DVar1;
    if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
      if ((layoutFlags & 0x10) == 0) {
        local_d8.blockNdx = curBlockNdx;
        iVar5 = glu::getDataTypeMatrixNumColumns(DVar1);
      }
      else {
        local_d8.blockNdx = curBlockNdx;
        iVar5 = glu::getDataTypeMatrixNumRows(DVar1);
      }
      local_d8.isRowMajor = SUB41((layoutFlags & 0x10) >> 4,0);
      iVar5 = iVar5 * iVar4;
      local_d8.offset = baseOffset_00;
      local_d8.matrixStride = iVar4;
    }
    else {
      local_d8.blockNdx = curBlockNdx;
      local_d8.offset = baseOffset_00;
      iVar5 = glu::getDataTypeScalarSize(DVar1);
      iVar5 = iVar5 << 2;
    }
    std::
    vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
    ::push_back(&layout->bufferVars,&local_d8);
  }
  baseOffset_00 = baseOffset_00 + iVar5;
  std::__cxx11::string::~string((string *)&local_d8);
LAB_013c8dde:
  return baseOffset_00 - baseOffset;
}

Assistant:

int computeReferenceLayout (
	BufferLayout&		layout,
	int					curBlockNdx,
	int					baseOffset,
	const std::string&	curPrefix,
	const VarType&		type,
	deUint32			layoutFlags)
{
	// Reference layout uses std430 rules by default. std140 rules are
	// choosen only for blocks that have std140 layout.
	const bool	isStd140			= (layoutFlags & LAYOUT_STD140) != 0;
	const int	baseAlignment		= isStd140 ? computeStd140BaseAlignment(type, layoutFlags)
											   : computeStd430BaseAlignment(type, layoutFlags);
	int			curOffset			= deAlign32(baseOffset, baseAlignment);
	const int	topLevelArraySize	= 1; // Default values
	const int	topLevelArrayStride	= 0;

	if (type.isBasicType())
	{
		const glu::DataType		basicType	= type.getBasicType();
		BufferVarLayoutEntry	entry;

		entry.name					= curPrefix;
		entry.type					= basicType;
		entry.arraySize				= 1;
		entry.arrayStride			= 0;
		entry.matrixStride			= 0;
		entry.topLevelArraySize		= topLevelArraySize;
		entry.topLevelArrayStride	= topLevelArrayStride;
		entry.blockNdx				= curBlockNdx;

		if (glu::isDataTypeMatrix(basicType))
		{
			// Array of vectors as specified in rules 5 & 7.
			const bool	isRowMajor			= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int	numVecs				= isRowMajor ? glu::getDataTypeMatrixNumRows(basicType)
														 : glu::getDataTypeMatrixNumColumns(basicType);

			entry.offset		= curOffset;
			entry.matrixStride	= baseAlignment;
			entry.isRowMajor	= isRowMajor;

			curOffset += numVecs*baseAlignment;
		}
		else
		{
			// Scalar or vector.
			entry.offset = curOffset;

			curOffset += getDataTypeByteSize(basicType);
		}

		layout.bufferVars.push_back(entry);
	}
	else if (type.isArrayType())
	{
		const VarType&	elemType	= type.getElementType();

		if (elemType.isBasicType() && !glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of scalars or vectors.
			const glu::DataType		elemBasicType	= elemType.getBasicType();
			const int				stride			= baseAlignment;
			BufferVarLayoutEntry	entry;

			entry.name					= curPrefix + "[0]"; // Array variables are always postfixed with [0]
			entry.type					= elemBasicType;
			entry.blockNdx				= curBlockNdx;
			entry.offset				= curOffset;
			entry.arraySize				= type.getArraySize();
			entry.arrayStride			= stride;
			entry.matrixStride			= 0;
			entry.topLevelArraySize		= topLevelArraySize;
			entry.topLevelArrayStride	= topLevelArrayStride;

			curOffset += stride*type.getArraySize();

			layout.bufferVars.push_back(entry);
		}
		else if (elemType.isBasicType() && glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of matrices.
			const glu::DataType			elemBasicType	= elemType.getBasicType();
			const bool					isRowMajor		= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int					numVecs			= isRowMajor ? glu::getDataTypeMatrixNumRows(elemBasicType)
																	 : glu::getDataTypeMatrixNumColumns(elemBasicType);
			const int					vecStride		= baseAlignment;
			BufferVarLayoutEntry		entry;

			entry.name					= curPrefix + "[0]"; // Array variables are always postfixed with [0]
			entry.type					= elemBasicType;
			entry.blockNdx				= curBlockNdx;
			entry.offset				= curOffset;
			entry.arraySize				= type.getArraySize();
			entry.arrayStride			= vecStride*numVecs;
			entry.matrixStride			= vecStride;
			entry.isRowMajor			= isRowMajor;
			entry.topLevelArraySize		= topLevelArraySize;
			entry.topLevelArrayStride	= topLevelArrayStride;

			curOffset += numVecs*vecStride*type.getArraySize();

			layout.bufferVars.push_back(entry);
		}
		else
		{
			DE_ASSERT(elemType.isStructType() || elemType.isArrayType());

			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
				curOffset += computeReferenceLayout(layout, curBlockNdx, curOffset, curPrefix + "[" + de::toString(elemNdx) + "]", type.getElementType(), layoutFlags);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStructPtr()->begin(); memberIter != type.getStructPtr()->end(); memberIter++)
			curOffset += computeReferenceLayout(layout, curBlockNdx, curOffset, curPrefix + "." + memberIter->getName(), memberIter->getType(), layoutFlags);

		curOffset = deAlign32(curOffset, baseAlignment);
	}

	return curOffset-baseOffset;
}